

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_face_only
          (REF_INTERP ref_interp,REF_INT faceid,REF_INT leading_dim,REF_DBL *from_scalar,
          REF_DBL *to_scalar)

{
  REF_CELL pRVar1;
  REF_GRID ref_grid;
  REF_MPI pRVar2;
  REF_GLOB *pRVar3;
  REF_INT *proc;
  bool bVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  REF_DBL *pRVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  REF_NODE pRVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  size_t __size;
  long lVar16;
  int iVar17;
  REF_INT RVar18;
  double dVar19;
  REF_INT n_donor;
  REF_INT local_154;
  REF_MPI local_150;
  REF_GLOB *l2c;
  REF_NODE local_140;
  void *local_138;
  REF_INT *local_130;
  void *local_128;
  REF_INT *donor_ret;
  REF_BOOL increase_fuzz;
  void *local_110;
  REF_INT *local_108;
  REF_CELL local_100;
  REF_DBL *local_f8;
  REF_INT *recept_node;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_scalar;
  long local_c8;
  REF_DBL *local_c0;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_INT nodes [27];
  
  pRVar1 = ref_interp->from_tet;
  ref_grid = ref_interp->to_grid;
  pRVar2 = ref_grid->mpi;
  pRVar12 = ref_grid->node;
  local_f8 = to_scalar;
  local_c0 = from_scalar;
  uVar5 = ref_grid_compact_surf_id_nodes(ref_grid,faceid,&nnode,&ncell,&l2c);
  if (uVar5 == 0) {
    iVar17 = pRVar12->max;
    if (0 < iVar17) {
      pRVar3 = pRVar12->global;
      lVar10 = 0;
      do {
        if ((-1 < pRVar3[lVar10]) &&
           ((l2c[lVar10] == -1 || (pRVar12->ref_mpi->id != pRVar12->part[lVar10])))) {
          ref_interp->cell[lVar10] = -0x39;
          iVar17 = pRVar12->max;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar17);
    }
    increase_fuzz = 0;
    bVar4 = true;
    iVar17 = 0xc;
    local_150 = pRVar2;
    local_140 = pRVar12;
    local_100 = pRVar1;
    while( true ) {
      if ((!bVar4) && (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, local_150->id == 0)
         ) {
        printf("retry tree search with %e fuzz\n");
      }
      uVar5 = ref_interp_tree(ref_interp,&increase_fuzz);
      if (uVar5 != 0) break;
      if ((ref_interp->instrument != 0) &&
         (uVar5 = ref_mpi_stopwatch_stop(local_150,"tree"), uVar5 != 0)) {
        pcVar14 = "locate clock";
        uVar9 = 0x8b2;
        goto LAB_0017bafe;
      }
      if ((long)increase_fuzz == 0) {
        uVar5 = local_140->max;
        if ((int)uVar5 < 1) goto LAB_0017bd6f;
        pRVar3 = local_140->global;
        lVar10 = 0;
        do {
          if ((-1 < pRVar3[lVar10]) &&
             ((l2c[lVar10] == -1 || (local_140->ref_mpi->id != local_140->part[lVar10])))) {
            ref_interp->cell[lVar10] = -1;
            uVar5 = local_140->max;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar5);
        bVar4 = 0 < (int)uVar5;
        if ((int)uVar5 < 1) {
LAB_0017bd6f:
          uVar15 = 0;
          bVar4 = false;
        }
        else {
          uVar11 = 0;
          uVar15 = 0;
          do {
            if ((-1 < local_140->global[uVar11]) && (l2c[uVar11] != -1)) {
              uVar15 = uVar15 + (local_140->ref_mpi->id == local_140->part[uVar11]);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar5);
          if ((int)uVar15 < 0) {
            pcVar14 = "malloc recept_bary of REF_DBL negative";
            uVar9 = 0x8c4;
            goto LAB_0017bd3a;
          }
        }
        pvVar6 = malloc((ulong)(uVar15 * 4) << 3);
        if (pvVar6 == (void *)0x0) {
          pcVar14 = "malloc recept_bary of REF_DBL NULL";
          uVar9 = 0x8c4;
LAB_0017c027:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar9,"ref_interp_face_only",pcVar14);
          return 2;
        }
        __size = (ulong)uVar15 << 2;
        pvVar7 = malloc(__size);
        if (pvVar7 == (void *)0x0) {
          pcVar14 = "malloc recept_cell of REF_INT NULL";
          uVar9 = 0x8c5;
          goto LAB_0017c027;
        }
        local_128 = pvVar7;
        recept_node = (REF_INT *)malloc(__size);
        if (recept_node == (REF_INT *)0x0) {
          pcVar14 = "malloc recept_node of REF_INT NULL";
          uVar9 = 0x8c6;
          goto LAB_0017c027;
        }
        local_130 = recept_node;
        pvVar7 = malloc(__size);
        if (pvVar7 == (void *)0x0) {
          pcVar14 = "malloc recept_ret of REF_INT NULL";
          uVar9 = 0x8c7;
          goto LAB_0017c027;
        }
        local_138 = pvVar7;
        local_108 = (REF_INT *)malloc(__size);
        if (local_108 == (REF_INT *)0x0) {
          pcVar14 = "malloc recept_proc of REF_INT NULL";
          uVar9 = 0x8c8;
          goto LAB_0017c027;
        }
        local_154 = 0;
        RVar18 = 0;
        local_110 = pvVar6;
        if (bVar4) {
          lVar10 = 0;
          RVar18 = 0;
          lVar16 = 0;
          pRVar12 = local_140;
          do {
            if (((-1 < pRVar12->global[lVar16]) && (l2c[lVar16] != -1)) &&
               (pRVar12->ref_mpi->id == pRVar12->part[lVar16])) {
              if (ref_interp->cell[lVar16] == -1) {
                pcVar14 = "node needs to be localized";
                uVar9 = 0x8cd;
                goto LAB_0017bd3a;
              }
              local_c8 = lVar10;
              uVar5 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar10),
                                          (REF_DBL *)((long)pvVar6 + (long)(RVar18 * 4) * 8));
              if (uVar5 != 0) {
                pcVar14 = "clip";
                uVar9 = 0x8d0;
                goto LAB_0017bafe;
              }
              lVar10 = (long)RVar18;
              local_108[lVar10] = ref_interp->part[lVar16];
              *(REF_INT *)((long)local_128 + lVar10 * 4) = ref_interp->cell[lVar16];
              local_130[lVar10] = (REF_INT)lVar16;
              *(REF_INT *)((long)local_138 + lVar10 * 4) = local_150->id;
              RVar18 = RVar18 + 1;
              uVar5 = local_140->max;
              lVar10 = local_c8;
              pRVar12 = local_140;
              pvVar6 = local_110;
              local_154 = RVar18;
            }
            lVar16 = lVar16 + 1;
            lVar10 = lVar10 + 0x20;
          } while (lVar16 < (int)uVar5);
        }
        if (l2c != (REF_GLOB *)0x0) {
          free(l2c);
        }
        proc = local_108;
        pRVar2 = local_150;
        uVar5 = ref_mpi_blindsend(local_150,local_108,local_128,1,RVar18,&donor_cell,&n_donor,1);
        if (uVar5 == 0) {
          uVar5 = ref_mpi_blindsend(pRVar2,proc,local_138,1,RVar18,&donor_ret,&n_donor,1);
          if (uVar5 == 0) {
            uVar5 = ref_mpi_blindsend(pRVar2,proc,local_130,1,RVar18,&donor_node,&n_donor,1);
            pvVar6 = local_110;
            if (uVar5 == 0) {
              uVar5 = ref_mpi_blindsend(pRVar2,proc,local_110,4,RVar18,&donor_bary,&n_donor,3);
              if (uVar5 == 0) {
                free(proc);
                free(local_138);
                free(local_130);
                free(local_128);
                free(pvVar6);
                RVar18 = n_donor;
                if (n_donor * leading_dim < 0) {
                  pcVar14 = "malloc donor_scalar of REF_DBL negative";
                  uVar9 = 0x8ee;
LAB_0017bd3a:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,uVar9,"ref_interp_face_only",pcVar14);
                  return 1;
                }
                pvVar6 = malloc((ulong)(uint)(n_donor * leading_dim) << 3);
                pRVar8 = local_c0;
                if (pvVar6 == (void *)0x0) {
                  pcVar14 = "malloc donor_scalar of REF_DBL NULL";
                  uVar9 = 0x8ee;
                  goto LAB_0017c027;
                }
                if (0 < RVar18) {
                  lVar10 = 0;
                  do {
                    uVar5 = ref_cell_nodes(local_100,donor_cell[lVar10],nodes);
                    if (uVar5 != 0) {
                      pcVar14 = "node needs to be localized";
                      uVar9 = 0x8f2;
                      goto LAB_0017bafe;
                    }
                    if (0 < leading_dim) {
                      lVar16 = lVar10 * (ulong)(uint)leading_dim;
                      uVar11 = 0;
                      do {
                        *(undefined8 *)((long)pvVar6 + uVar11 * 8 + lVar16 * 8) = 0;
                        dVar19 = 0.0;
                        lVar13 = 0;
                        do {
                          dVar19 = dVar19 + donor_bary
                                            [(ulong)((uint)lVar10 & 0x3fffffff) * 4 + lVar13] *
                                            pRVar8[nodes[lVar13] * leading_dim + (int)uVar11];
                          *(double *)((long)pvVar6 + uVar11 * 8 + lVar16 * 8) = dVar19;
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 4);
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != (uint)leading_dim);
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < n_donor);
                }
                if (donor_cell != (REF_INT *)0x0) {
                  free(donor_cell);
                }
                if (donor_bary != (REF_DBL *)0x0) {
                  free(donor_bary);
                }
                uVar5 = ref_mpi_blindsend(local_150,donor_ret,pvVar6,leading_dim,n_donor,
                                          &recept_scalar,&local_154,3);
                if (uVar5 == 0) {
                  uVar5 = ref_mpi_blindsend(local_150,donor_ret,donor_node,1,n_donor,&recept_node,
                                            &local_154,1);
                  if (uVar5 == 0) {
                    free(pvVar6);
                    if (donor_node != (REF_INT *)0x0) {
                      free(donor_node);
                    }
                    if (donor_ret != (REF_INT *)0x0) {
                      free(donor_ret);
                    }
                    if (0 < (long)local_154) {
                      lVar10 = 0;
                      pRVar8 = recept_scalar;
                      do {
                        if (0 < leading_dim) {
                          iVar17 = recept_node[lVar10];
                          uVar11 = 0;
                          do {
                            local_f8[(long)iVar17 * (long)leading_dim + uVar11] = pRVar8[uVar11];
                            uVar11 = uVar11 + 1;
                          } while ((uint)leading_dim != uVar11);
                        }
                        lVar10 = lVar10 + 1;
                        pRVar8 = pRVar8 + leading_dim;
                      } while (lVar10 != local_154);
                    }
                    if (recept_node != (REF_INT *)0x0) {
                      free(recept_node);
                    }
                    if (recept_scalar != (REF_DBL *)0x0) {
                      free(recept_scalar);
                    }
                    uVar5 = ref_node_ghost_dbl(local_140,local_f8,leading_dim);
                    if (uVar5 == 0) {
                      return 0;
                    }
                    pcVar14 = "ghost";
                    uVar9 = 0x915;
                  }
                  else {
                    pcVar14 = "blind send node";
                    uVar9 = 0x905;
                  }
                }
                else {
                  pcVar14 = "blind send bary";
                  uVar9 = 0x902;
                }
              }
              else {
                pcVar14 = "blind send bary";
                uVar9 = 0x8e6;
              }
            }
            else {
              pcVar14 = "blind send node";
              uVar9 = 0x8e3;
            }
          }
          else {
            pcVar14 = "blind send ret";
            uVar9 = 0x8e0;
          }
        }
        else {
          pcVar14 = "blind send cell";
          uVar9 = 0x8dd;
        }
        goto LAB_0017bafe;
      }
      bVar4 = false;
      iVar17 = iVar17 + -1;
      if (iVar17 == 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x8b5,"ref_interp_face_only","unable to grow fuzz to find tree candidate",0,
               (long)increase_fuzz);
        return 1;
      }
    }
    pcVar14 = "tree";
    uVar9 = 0x8b0;
  }
  else {
    pcVar14 = "l2c";
    uVar9 = 0x8a0;
  }
LAB_0017bafe:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar9,
         "ref_interp_face_only",(ulong)uVar5,pcVar14);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_interp_face_only(REF_INTERP ref_interp, REF_INT faceid,
                                        REF_INT leading_dim,
                                        REF_DBL *from_scalar,
                                        REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell = ref_interp_from_tet(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_BOOL increase_fuzz;
  REF_INT tries;

  RSS(ref_grid_compact_surf_id_nodes(to_grid, faceid, &nnode, &ncell, &l2c),
      "l2c");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = -57; /* magic number to skip */
    }
  }

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = REF_EMPTY; /* set back */
    }
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  ref_free(l2c);

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");

  return REF_SUCCESS;
}